

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_biquad_clear_cache(ma_biquad *pBQ)

{
  ma_biquad *pBQ_local;
  ma_result local_4;
  
  if (pBQ == (ma_biquad *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    if (pBQ->format == ma_format_f32) {
      pBQ->pR1->f32 = 0.0;
      pBQ->pR2->f32 = 0.0;
    }
    else {
      pBQ->pR1->f32 = 0.0;
      pBQ->pR2->f32 = 0.0;
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_biquad_clear_cache(ma_biquad* pBQ)
{
    if (pBQ == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pBQ->format == ma_format_f32) {
        pBQ->pR1->f32 = 0;
        pBQ->pR2->f32 = 0;
    } else {
        pBQ->pR1->s32 = 0;
        pBQ->pR2->s32 = 0;
    }

    return MA_SUCCESS;
}